

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O1

variant_type __thiscall pstore::uuid::variant(uuid *this)

{
  variant_type vVar1;
  byte bVar2;
  
  bVar2 = (this->data_)._M_elems[8];
  vVar1 = ncs;
  if ((char)bVar2 < '\0') {
    bVar2 = bVar2 & 0xe0;
    vVar1 = microsoft;
    if (bVar2 != 0xc0) {
      if (bVar2 != 0xe0) {
        assert_failed("(octet & 0b11100000) == 0b11100000",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/uuid.cpp"
                      ,0xc0);
      }
      vVar1 = future;
    }
  }
  return vVar1;
}

Assistant:

auto uuid::variant () const noexcept -> variant_type {
        auto const octet = data_[variant_octet];
        // 0b0xxxxxxx
        if ((octet & 0b10000000) == 0b00000000) { //! OCLINT (PH - bitwise operator is just fine)
            return variant_type::ncs;
        }
        // 0b10xxxxxx
        if ((octet & 0b11000000) == 0b10000000) { //! OCLINT (PH - bitwise operator is just fine)
            return variant_type::rfc_4122;
        }
        // 0b110xxxxx
        if ((octet & 0b11100000) == 0b11000000) { //! OCLINT (PH - bitwise operator is just fine)
            return variant_type::microsoft;
        }
        // 0b111xxxx
        PSTORE_ASSERT ((octet & 0b11100000) ==
                       0b11100000); //! OCLINT (PH - bitwise operator is just fine)
        return variant_type::future;
    }